

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fromucs.c
# Opt level: O3

void charset_emit(void *ctx,long output)

{
  char cVar1;
  char *pcVar2;
  uint uVar3;
  char *pcVar5;
  char outval;
  int iVar4;
  
  if (output == 0xffff) {
    iVar4 = *(int *)((long)ctx + 0x18);
    if (*(int *)((long)ctx + 8) < iVar4) {
LAB_001156a2:
      *(undefined4 *)((long)ctx + 0x1c) = 1;
      return;
    }
    if (iVar4 < 1) {
      return;
    }
    pcVar5 = *(char **)((long)ctx + 0x10);
  }
  else {
    outval = (char)output;
    if (*(int *)((long)ctx + 8) < 1) goto LAB_001156a2;
    iVar4 = 1;
    pcVar5 = &outval;
  }
  uVar3 = iVar4 + 1;
  do {
    cVar1 = *pcVar5;
    pcVar2 = *ctx;
    *(char **)ctx = pcVar2 + 1;
    *pcVar2 = cVar1;
    *(int *)((long)ctx + 8) = *(int *)((long)ctx + 8) + -1;
    pcVar5 = pcVar5 + 1;
    uVar3 = uVar3 - 1;
  } while (1 < uVar3);
  return;
}

Assistant:

static void charset_emit(void *ctx, long int output)
{
    struct charset_emit_param *param = (struct charset_emit_param *)ctx;
    char outval;
    char const *p;
    int outlen;

    if (output == ERROR) {
        p = param->errstr;
        outlen = param->errlen;
    } else {
        outval = output;
        p = &outval;
        outlen = 1;
    }

    if (param->outlen >= outlen) {
        while (outlen > 0) {
            *param->output++ = *p++;
            param->outlen--;
            outlen--;
        }
    } else {
        param->stopped = 1;
    }
}